

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O2

int __thiscall
btLemkeAlgorithm::findLexicographicMinimum(btLemkeAlgorithm *this,btMatrixXf *A,int *pivotColIndex)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  uint numRows;
  int j;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  btAlignedObjectArray<float> *this_00;
  int i;
  ulong uVar11;
  float fVar12;
  btAlignedObjectArray<btVectorX<float>_> Rows;
  btVectorXf vec;
  btAlignedObjectArray<btVectorX<float>_> local_80;
  ulong local_60;
  int *local_58;
  btAlignedObjectArray<float> local_50;
  
  uVar1 = A->m_rows;
  local_80.m_ownsMemory = true;
  local_80.m_data = (btVectorX<float> *)0x0;
  local_80.m_size = 0;
  local_80.m_capacity = 0;
  numRows = uVar1 + 1;
  uVar11 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  local_60 = (ulong)(uVar1 * 2 + 1);
  local_58 = pivotColIndex;
  for (; uVar11 != uVar6; uVar11 = uVar11 + 1) {
    btVectorX<float>::btVectorX((btVectorX<float> *)&local_50,numRows);
    btVectorX<float>::setZero((btVectorX<float> *)&local_50);
    btAlignedObjectArray<btVectorX<float>_>::push_back(&local_80,(btVectorX<float> *)&local_50);
    iVar2 = A->m_cols;
    iVar8 = (int)uVar11 * iVar2;
    pfVar3 = (A->m_storage).m_data;
    fVar12 = pfVar3[(long)iVar8 + (long)*local_58];
    if (0.0 < fVar12) {
      pfVar4 = local_80.m_data[uVar11].m_storage.m_data;
      *pfVar4 = pfVar3[(int)local_60 + iVar8] / fVar12;
      pfVar4[1] = pfVar3[(int)(iVar8 + uVar1 * 2)] / fVar12;
      for (lVar9 = 0; (ulong)numRows - 2 != lVar9; lVar9 = lVar9 + 1) {
        pfVar4[lVar9 + 2] = pfVar3[iVar2 * (int)uVar11 + 1 + (int)lVar9] / fVar12;
      }
    }
    btAlignedObjectArray<float>::~btAlignedObjectArray(&local_50);
  }
  for (lVar9 = 0; lVar9 < local_80.m_size; lVar9 = lVar9 + 1) {
    fVar12 = btVectorX<float>::nrm2(local_80.m_data + lVar9);
    if (0.0 < fVar12) {
      for (lVar7 = 0; lVar7 < local_80.m_size; lVar7 = lVar7 + 1) {
        if (lVar9 != lVar7) {
          fVar12 = btVectorX<float>::nrm2(local_80.m_data + lVar7);
          if (0.0 < fVar12) {
            this_00 = &local_50;
            btVectorX<float>::btVectorX((btVectorX<float> *)&local_50,numRows);
            for (lVar10 = 0; lVar10 <= (int)uVar1; lVar10 = lVar10 + 1) {
              this_00 = (btAlignedObjectArray<float> *)local_80.m_data[lVar9].m_storage.m_data;
              local_50.m_data[lVar10] =
                   local_80.m_data[lVar7].m_storage.m_data[lVar10] -
                   *(float *)(&this_00->field_0x0 + lVar10 * 4);
            }
            bVar5 = LexicographicPositive((btLemkeAlgorithm *)this_00,(btVectorXf *)&local_50);
            btAlignedObjectArray<float>::~btAlignedObjectArray(&local_50);
            if (!bVar5) {
              break;
            }
          }
        }
      }
      if (local_80.m_size == (int)lVar7) goto LAB_001994e6;
    }
  }
  lVar9 = 0;
LAB_001994e6:
  btAlignedObjectArray<btVectorX<float>_>::~btAlignedObjectArray(&local_80);
  return (int)lVar9;
}

Assistant:

int btLemkeAlgorithm::findLexicographicMinimum(const btMatrixXu& A, const int & pivotColIndex) {
	  int RowIndex = 0;
	  int dim = A.rows();
	  btAlignedObjectArray<btVectorXu> Rows;
	  for (int row = 0; row < dim; row++) 
	  {

		  btVectorXu vec(dim + 1);
		  vec.setZero();//, INIT, 0.)
		  Rows.push_back(vec);
		  btScalar a = A(row, pivotColIndex);
		  if (a > 0) {
			  Rows[row][0] = A(row, 2 * dim + 1) / a;
			  Rows[row][1] = A(row, 2 * dim) / a;
			  for (int j = 2; j < dim + 1; j++)
				  Rows[row][j] = A(row, j - 1) / a;

#ifdef BT_DEBUG_OSTREAM
		//		if (DEBUGLEVEL) {
			//	  cout << "Rows(" << row << ") = " << Rows[row] << endl;
				// }
#endif 
		  }
	  }

	  for (int i = 0; i < Rows.size(); i++) 
	  {
		  if (Rows[i].nrm2() > 0.) {

			  int j = 0;
			  for (; j < Rows.size(); j++) 
			  {
				  if(i != j)
				  {
					  if(Rows[j].nrm2() > 0.)
					  {
						  btVectorXu test(dim + 1);
						  for (int ii=0;ii<dim+1;ii++)
						  {
							  test[ii] = Rows[j][ii] - Rows[i][ii];
						  }

						  //=Rows[j] - Rows[i]
						  if (! LexicographicPositive(test))
							  break;
					  }
				  }
			  }

			  if (j == Rows.size()) 
			  {
				  RowIndex += i;
				  break;
			  }
		  }
	  }

	  return RowIndex;
  }